

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprint.c
# Opt level: O0

void PPrintMathML(TidyDocImpl *doc,uint indent,Node *node)

{
  Node *pNStack_28;
  uint mode;
  Node *content;
  Node *node_local;
  uint indent_local;
  TidyDocImpl *doc_local;
  
  PPrintTag(doc,4,indent,node);
  for (pNStack_28 = node->content; pNStack_28 != (Node *)0x0; pNStack_28 = pNStack_28->next) {
    prvTidyPPrintTree(doc,4,indent,pNStack_28);
  }
  PPrintEndTag(doc,4,indent,node);
  return;
}

Assistant:

static void PPrintMathML( TidyDocImpl* doc, uint indent, Node *node )
{
    Node *content;
    uint mode = OtherNamespace;

    PPrintTag( doc, mode, indent, node );

    for ( content = node->content; content; content = content->next )
           TY_(PPrintTree)( doc, mode, indent, content );

    PPrintEndTag( doc, mode, indent, node );
}